

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

LineInterpolationMethod
tcu::verifyLineGroupInterpolation
          (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  undefined8 *puVar1;
  float wb;
  float afVar2 [2];
  pointer pSVar3;
  undefined1 auVar4 [16];
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  bool bVar12;
  float fVar13;
  int iVar14;
  MessageBuilder *pMVar15;
  ulong *puVar16;
  Surface *pSVar17;
  ulong uVar18;
  long lVar19;
  SingleSampleWideLineCandidate *__result;
  SingleSampleWideLineCandidate *pSVar20;
  ushort uVar21;
  int iVar22;
  size_t __n;
  allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate> *__alloc;
  int iVar23;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int lineNdx;
  LineInterpolationMethod LVar24;
  int iVar25;
  size_type sVar26;
  pointer *ppVVar27;
  int dy;
  int iVar28;
  string *this;
  uint uVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  int minorOffset;
  Vec3 *a;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined8 uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  float __x;
  float fVar45;
  reference rVar46;
  int local_5ac;
  int local_5a0;
  SingleSampleWideLineCandidate *local_598;
  RGBA color;
  SingleSampleWideLineCandidate *local_570;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  IVec2 rootPosition;
  undefined8 local_548;
  Vec4 valueMin;
  IVec2 minorDirection;
  Vector<float,_3> local_508;
  undefined8 local_4f8;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  Vec2 expandedP0;
  float fStack_4e0;
  IVec2 idealRootPos;
  Vec2 expandedP1;
  Vec2 offset;
  undefined8 uStack_478;
  IVec3 formatLimit;
  Vector<float,_3> local_420;
  pointer local_410;
  int *local_408;
  int *local_400;
  int *local_3f8;
  size_type local_3f0;
  int numRasterized;
  IVec2 viewportSize;
  IVec3 pixelNativeColor;
  Surface errorMask;
  undefined1 *local_378;
  float local_370;
  Vector<float,_3> local_368;
  undefined1 *local_358;
  float local_350;
  Vector<float,_3> local_348;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rootPixelLocation;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> effectiveLines;
  Vector<float,_3> local_304;
  LineExitDiamondGenerator diamondGenerator;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> screenspaceLines;
  long alStack_248 [27];
  undefined8 uStack_170;
  Vector<int,_3> aVStack_168 [2];
  Vector<float,_3> aVStack_150 [9];
  Vector<float,_3> local_e4;
  TextureLevel referenceLineMap;
  vector<bool,_std::allocator<bool>_> lineIsXMajor;
  PixelBufferAccess local_58;
  
  if (args->numSamples == 0) {
    if ((scene->lineWidth != 1.0) || (NAN(scene->lineWidth))) {
      viewportSize.m_data[0] = surface->m_width;
      viewportSize.m_data[1] = surface->m_height;
      Surface::Surface(&errorMask,viewportSize.m_data[0],viewportSize.m_data[1]);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&effectiveLines,
                 (long)(scene->lines).
                       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(scene->lines).
                       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6,
                 (allocator_type *)&screenspaceLines);
      std::vector<bool,_std::allocator<bool>_>::vector
                (&lineIsXMajor,
                 (long)(scene->lines).
                       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(scene->lines).
                       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6,
                 (allocator_type *)&screenspaceLines);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&rootPixelLocation,
               (long)(scene->lines).
                     super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(scene->lines).
                     super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 6,
               (allocator_type *)&screenspaceLines);
      ppVVar27 = &screenspaceLines.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      screenspaceLines.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar27);
      std::operator<<((ostream *)ppVVar27,"Verifying rasterization result. Native format is RGB");
      local_3f8 = &args->redBits;
      pMVar15 = MessageBuilder::operator<<((MessageBuilder *)&screenspaceLines,local_3f8);
      local_400 = &args->greenBits;
      pMVar15 = MessageBuilder::operator<<(pMVar15,local_400);
      local_408 = &args->blueBits;
      pMVar15 = MessageBuilder::operator<<(pMVar15,local_408);
      MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar27);
      if ((8 < *local_3f8) || ((8 < *local_400 || (8 < *local_408)))) {
        ppVVar27 = &screenspaceLines.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        screenspaceLines.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar27);
        std::operator<<((ostream *)ppVVar27,
                        "Warning! More than 8 bits in a color channel, this may produce false negatives."
                       );
        MessageBuilder::operator<<
                  ((MessageBuilder *)&screenspaceLines,(EndMessageToken *)&TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar27);
      }
      screenspaceLines.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&DAT_1e00000000;
      TextureLevel::TextureLevel
                (&referenceLineMap,(TextureFormat *)&screenspaceLines,surface->m_width,
                 surface->m_height,1);
      TextureLevel::getAccess((PixelBufferAccess *)&screenspaceLines,&referenceLineMap);
      diamondGenerator.m_v0.m_data = (float  [4])ZEXT816(0);
      clear((PixelBufferAccess *)&screenspaceLines,(IVec4 *)&diamondGenerator);
      Surface::getAccess((PixelBufferAccess *)&screenspaceLines,&errorMask);
      diamondGenerator.m_v0.m_data = (float  [4])(ZEXT816(0x3f80000000000000) << 0x40);
      clear((PixelBufferAccess *)&screenspaceLines,&diamondGenerator.m_v0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&screenspaceLines,
                 (long)(scene->lines).
                       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(scene->lines).
                       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6,
                 (allocator_type *)&diamondGenerator);
      local_410 = (pointer)log;
      anon_unknown_3::genScreenSpaceLines(&screenspaceLines,&scene->lines,&viewportSize);
      fVar13 = scene->lineWidth;
      TextureLevel::getAccess(&local_58,&referenceLineMap);
      anon_unknown_3::setMaskMapCoverageBitForLines
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &screenspaceLines.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                 ,fVar13,&local_58);
      lVar31 = 0;
      for (sVar26 = 0;
          (long)sVar26 <
          (long)(int)((ulong)((long)(scene->lines).
                                    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(scene->lines).
                                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 6);
          sVar26 = sVar26 + 1) {
        puVar1 = (undefined8 *)
                 ((long)(screenspaceLines.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar31);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        bVar12 = anon_unknown_3::isPackedSSLineXMajor
                           ((Vec4 *)((long)(screenspaceLines.
                                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                    lVar31));
        rVar46 = std::vector<bool,_std::allocator<bool>_>::operator[](&lineIsXMajor,sVar26);
        puVar16 = rVar46._M_p;
        if (bVar12) {
          *puVar16 = *puVar16 | rVar46._M_mask;
          fVar13 = scene->lineWidth;
          uVar40 = 0xbf80000000000000;
        }
        else {
          *puVar16 = *puVar16 & ~rVar46._M_mask;
          fVar13 = scene->lineWidth;
          uVar40 = 0xbf800000;
        }
        diamondGenerator.m_v0.m_data[0] = (float)(int)uVar40;
        diamondGenerator.m_v0.m_data[1] = (float)(int)((ulong)uVar40 >> 0x20);
        operator*((fVar13 + -1.0) * 0.5,(Vector<float,_2> *)&diamondGenerator);
        local_568 = (float)uVar6;
        fStack_564 = (float)((ulong)uVar6 >> 0x20);
        fStack_560 = (float)uVar7;
        fStack_55c = (float)((ulong)uVar7 >> 0x20);
        auVar39._0_4_ = local_568 + offset.m_data[0];
        auVar39._4_4_ = fStack_564 + offset.m_data[1];
        auVar39._8_4_ = fStack_560 + offset.m_data[0];
        auVar39._12_4_ = fStack_55c + offset.m_data[1];
        *(undefined1 (*) [16])
         ((long)(effectiveLines.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_data + lVar31) = auVar39;
        lVar31 = lVar31 + 0x10;
      }
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&screenspaceLines.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      sVar26 = 0;
      while( true ) {
        if ((long)(int)((ulong)((long)(scene->lines).
                                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(scene->lines).
                                     super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 6) <=
            (long)sVar26) break;
        rVar46 = std::vector<bool,_std::allocator<bool>_>::operator[](&lineIsXMajor,sVar26);
        uVar32 = rVar46._M_mask & *rVar46._M_p;
        pSVar17 = (Surface *)&surface->m_height;
        if (uVar32 != 0) {
          pSVar17 = surface;
        }
        iVar22 = pSVar17->m_width;
        rr::LineExitDiamondGenerator::LineExitDiamondGenerator(&diamondGenerator);
        memset(&screenspaceLines,0,0x100);
        numRasterized = 0x20;
        afVar2 = *(float (*) [2])
                  effectiveLines.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar26].m_data;
        local_4f8 = *(Vec3 **)(effectiveLines.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[sVar26].m_data + 2);
        valueMin.m_data[0] = SUB84(local_4f8,0);
        valueMin.m_data[1] = (float)((ulong)local_4f8 >> 0x20);
        offset.m_data = afVar2;
        anon_unknown_3::getLineCoordAtAxisCoord
                  ((anon_unknown_3 *)&expandedP0,&offset,(Vec2 *)&valueMin,uVar32 != 0,-1.0);
        valueMin.m_data[0] = SUB84(local_4f8,0);
        valueMin.m_data[1] = (float)((ulong)local_4f8 >> 0x20);
        offset.m_data = afVar2;
        anon_unknown_3::getLineCoordAtAxisCoord
                  ((anon_unknown_3 *)&expandedP1,&offset,(Vec2 *)&valueMin,uVar32 != 0,
                   (float)iVar22 + 1.0);
        offset.m_data[1] = expandedP0.m_data[1];
        uStack_478 = 0x3f80000000000000;
        valueMin.m_data[0] = expandedP1.m_data[0];
        valueMin.m_data[1] = expandedP1.m_data[1];
        valueMin.m_data[2] = 0.0;
        valueMin.m_data[3] = 1.0;
        rr::LineExitDiamondGenerator::init(&diamondGenerator,(EVP_PKEY_CTX *)&offset);
        offset.m_data[0] = 9.18355e-41;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (rootPixelLocation.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + sVar26,(long)iVar22,
                   (value_type_conflict2 *)&offset);
        uVar18 = (ulong)(uint)numRasterized;
        while (ppVVar27 = (pointer *)&screenspaceLines, (int)uVar18 == 0x20) {
          rr::LineExitDiamondGenerator::rasterize
                    (&diamondGenerator,(LineExitDiamond *)ppVVar27,0x20,&numRasterized);
          for (lVar31 = 0; uVar18 = (ulong)numRasterized, lVar31 < (long)uVar18; lVar31 = lVar31 + 1
              ) {
            Vector<int,_2>::Vector((Vector<int,_2> *)&offset,(Vector<int,_2> *)ppVVar27);
            fVar13 = offset.m_data[1];
            if (uVar32 != 0) {
              fVar13 = offset.m_data[0];
            }
            if ((int)fVar13 < iVar22 && -1 < (int)fVar13) {
              uVar21 = offset.m_data[0]._0_2_;
              if (uVar32 != 0) {
                uVar21 = offset.m_data[1]._0_2_;
              }
              rootPixelLocation.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[sVar26].
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[(uint)fVar13] = (uint)uVar21;
            }
            ppVVar27 = ppVVar27 + 1;
          }
        }
        rr::LineExitDiamondGenerator::~LineExitDiamondGenerator(&diamondGenerator);
        sVar26 = sVar26 + 1;
      }
      local_5a0 = 0;
      local_5ac = 0;
      __n = 1;
      while (log = (TestLog *)local_410, iVar22 = (int)__n, iVar22 < surface->m_height + -1) {
        iVar14 = 0;
        for (iVar23 = 1; iVar23 < surface->m_width + -1; iVar23 = iVar23 + 1) {
          color.m_value =
               *(deUint32 *)
                ((long)(surface->m_pixels).m_ptr + (long)(surface->m_width * iVar22 + iVar23) * 4);
          anon_unknown_3::convertRGB8ToNativeFormat((anon_unknown_3 *)&pixelNativeColor,&color,args)
          ;
          formatLimit.m_data[0] = ~(-1 << ((byte)args->redBits & 0x1f));
          formatLimit.m_data[1] = ~(-1 << ((byte)args->greenBits & 0x1f));
          formatLimit.m_data[2] = ~(-1 << ((byte)args->blueBits & 0x1f));
          diamondGenerator.m_v1.m_data[0] = 0.0;
          diamondGenerator.m_v1.m_data[1] = 0.0;
          diamondGenerator.m_v0.m_data = (float  [4])ZEXT816(0);
          uVar29 = 0;
          uVar30 = 0xffff;
          for (iVar28 = -1; iVar28 != 2; iVar28 = iVar28 + 1) {
            for (iVar25 = 0; iVar25 != 3; iVar25 = iVar25 + 1) {
              TextureLevel::getAccess((PixelBufferAccess *)&screenspaceLines,&referenceLineMap);
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)&offset,
                         (int)(PixelBufferAccess *)&screenspaceLines,iVar14 + iVar25,iVar22 + iVar28
                        );
              uVar29 = uVar29 | (uint)offset.m_data[0];
              uVar30 = uVar30 & (uint)offset.m_data[0];
            }
          }
          if (uVar30 == 0) {
            screenspaceLines.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(screenspaceLines.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,0xff000000);
            bVar12 = anon_unknown_3::compareColors
                               (&color,(RGBA *)&screenspaceLines,*local_3f8,*local_400,*local_408);
            if (!bVar12) goto LAB_0094a03a;
          }
          else {
LAB_0094a03a:
            local_598 = (SingleSampleWideLineCandidate *)0x0;
            local_570 = (SingleSampleWideLineCandidate *)0x0;
            sVar26 = 0;
            while (pSVar3 = (scene->lines).
                            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  (long)sVar26 <
                  (long)(int)((ulong)((long)(scene->lines).
                                            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar3) >> 6)) {
              local_3f0 = sVar26;
              if ((uVar29 >> ((uint)sVar26 & 0x1f) & 1) != 0) {
                fVar13 = *(float *)((long)pSVar3[sVar26].positions[0].m_data + 0xc);
                wb = *(float *)((long)(pSVar3[sVar26].positions + 1) + 0xc);
                local_508.m_data._0_8_ =
                     *(undefined8 *)
                      effectiveLines.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[sVar26].m_data;
                local_420.m_data._0_8_ =
                     *(undefined8 *)
                      (effectiveLines.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[sVar26].m_data + 2);
                rVar46 = std::vector<bool,_std::allocator<bool>_>::operator[](&lineIsXMajor,sVar26);
                bVar12 = (*rVar46._M_p & rVar46._M_mask) == 0;
                iVar28 = iVar23;
                if (bVar12) {
                  iVar28 = iVar22;
                }
                iVar28 = (int)(short)rootPixelLocation.
                                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar28];
                idealRootPos.m_data[1] = iVar28;
                idealRootPos.m_data[0] = iVar23;
                if (bVar12) {
                  idealRootPos.m_data[1] = iVar22;
                  idealRootPos.m_data[0] = iVar28;
                }
                minorDirection.m_data[1]._0_1_ = !bVar12;
                minorDirection.m_data[0] = (uint)bVar12;
                minorDirection.m_data[1]._1_3_ = 0;
                lVar31 = -0xf0;
                do {
                  *(undefined8 *)((long)&uStack_170 + lVar31) = 0;
                  Vector<int,_3>::Vector((Vector<int,_3> *)((long)aVStack_168[0].m_data + lVar31));
                  Vector<int,_3>::Vector((Vector<int,_3> *)((long)aVStack_168[1].m_data + lVar31));
                  Vector<float,_3>::Vector
                            ((Vector<float,_3> *)((long)aVStack_150[0].m_data + lVar31));
                  Vector<float,_3>::Vector
                            ((Vector<float,_3> *)((long)aVStack_150[1].m_data + lVar31));
                  Vector<float,_3>::Vector
                            ((Vector<float,_3> *)((long)aVStack_150[2].m_data + lVar31));
                  Vector<float,_3>::Vector
                            ((Vector<float,_3> *)((long)aVStack_150[3].m_data + lVar31));
                  lVar31 = lVar31 + 0x50;
                } while (lVar31 != 0);
                screenspaceLines.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)(local_3f0 & 0xffffffff);
                for (iVar28 = -1; iVar28 != 2; iVar28 = iVar28 + 1) {
                  operator*(iVar28,&minorDirection);
                  operator+(&idealRootPos,(Vector<int,_2> *)&offset);
                  if ((((surface->m_width <= rootPosition.m_data[0] || rootPosition.m_data[0] < 0)
                       || (rootPosition.m_data[1] < 0)) ||
                      (surface->m_height <= rootPosition.m_data[1])) ||
                     ((*(uint *)((long)(surface->m_pixels).m_ptr +
                                (long)(rootPosition.m_data[1] * surface->m_width +
                                      rootPosition.m_data[0]) * 4) & 0xffffff) != 0)) {
                    anon_unknown_3::calcSingleSampleLineInterpolationRange
                              ((anon_unknown_3 *)&offset,(Vec2 *)&local_508,fVar13,
                               (Vec2 *)&local_420,wb,&rootPosition,args->subpixelBits);
                    fVar5 = 1.0;
                    if ((float)uStack_478 <= 1.0) {
                      fVar5 = (float)uStack_478;
                    }
                    operator*((tcu *)&expandedP0,
                              (float)(~-(uint)((float)uStack_478 < 0.0) & (uint)fVar5),
                              (scene->lines).
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              ._M_impl.super__Vector_impl_data._M_start[sVar26].colors);
                    fVar5 = 1.0;
                    if (uStack_478._4_4_ <= 1.0) {
                      fVar5 = uStack_478._4_4_;
                    }
                    operator*((tcu *)&expandedP1,
                              (float)(~-(uint)(uStack_478._4_4_ < 0.0) & (uint)fVar5),
                              (scene->lines).
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              ._M_impl.super__Vector_impl_data._M_start[sVar26].colors + 1);
                    operator+((tcu *)&valueMin,(Vector<float,_4> *)&expandedP0,
                              (Vector<float,_4> *)&expandedP1);
                    fVar5 = 1.0;
                    if (offset.m_data[0] <= 1.0) {
                      fVar5 = offset.m_data[0];
                    }
                    operator*((tcu *)&expandedP1,
                              (float)(~-(uint)(offset.m_data[0] < 0.0) & (uint)fVar5),
                              (scene->lines).
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              ._M_impl.super__Vector_impl_data._M_start[sVar26].colors);
                    fVar5 = 1.0;
                    if (offset.m_data[1] <= 1.0) {
                      fVar5 = offset.m_data[1];
                    }
                    operator*((tcu *)&numRasterized,
                              (float)(~-(uint)(offset.m_data[1] < 0.0) & (uint)fVar5),
                              (scene->lines).
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              ._M_impl.super__Vector_impl_data._M_start[sVar26].colors + 1);
                    operator+((tcu *)&expandedP0,(Vector<float,_4> *)&expandedP1,
                              (Vector<float,_4> *)&numRasterized);
                    fVar11 = expandedP0.m_data[0];
                    fVar10 = valueMin.m_data[2];
                    fVar9 = valueMin.m_data[1];
                    fVar5 = valueMin.m_data[0];
                    auVar38._0_4_ = (float)formatLimit.m_data[0];
                    lVar31 = CONCAT44(fStack_4e0,expandedP0.m_data[1]);
                    auVar41._0_4_ = (float)formatLimit.m_data[1];
                    auVar41._4_4_ = (float)formatLimit.m_data[2];
                    auVar41._8_8_ = 0;
                    auVar38._4_4_ = auVar41._0_4_;
                    auVar38._8_4_ = auVar41._4_4_;
                    auVar38._12_4_ = auVar38._0_4_;
                    fVar45 = expandedP0.m_data[0] * auVar38._0_4_;
                    auVar4._4_4_ = valueMin.m_data[1] * auVar41._0_4_;
                    auVar4._0_4_ = valueMin.m_data[0] * auVar38._0_4_;
                    auVar4._8_4_ = valueMin.m_data[2] * auVar41._4_4_;
                    auVar4._12_4_ = fVar45;
                    auVar39 = minps(auVar38,auVar4);
                    fVar43 = (float)(-(uint)(0.0 <= valueMin.m_data[0] * auVar38._0_4_) &
                                    auVar39._0_4_);
                    fVar44 = (float)(-(uint)(0.0 <= valueMin.m_data[1] * auVar41._0_4_) &
                                    auVar39._4_4_);
                    __x = (float)(-(uint)(0.0 <= valueMin.m_data[2] * auVar41._4_4_) & auVar39._8_4_
                                 );
                    local_548 = CONCAT44(fVar44,fVar43);
                    auVar42._4_4_ = fStack_4e0 * auVar41._4_4_;
                    auVar42._0_4_ = expandedP0.m_data[1] * auVar41._0_4_;
                    auVar42._8_8_ = 0;
                    auVar42 = minps(auVar41,auVar42);
                    uStack_4f0 = auVar42._8_4_;
                    uStack_4ec = auVar42._12_4_;
                    local_4f8 = (Vec3 *)CONCAT44(-(uint)(0.0 <= fStack_4e0 * auVar41._4_4_) &
                                                 auVar42._4_4_,
                                                 -(uint)(0.0 <= expandedP0.m_data[1] * auVar41._0_4_
                                                        ) & auVar42._0_4_);
                    fVar34 = floorf(__x);
                    fVar35 = ceilf(fVar44);
                    fVar43 = floorf(fVar43);
                    fVar44 = floorf(fVar44);
                    fVar36 = ceilf((float)local_4f8);
                    fVar37 = ceilf(local_4f8._4_4_);
                    auVar8._4_4_ = (int)fVar44;
                    auVar8._0_4_ = (int)fVar43;
                    auVar8._8_4_ = (int)fVar34;
                    auVar8._12_4_ = (int)fVar35;
                    if (((((int)fVar43 <= pixelNativeColor.m_data[0]) &&
                         ((int)fVar44 <= pixelNativeColor.m_data[1])) &&
                        (((int)fVar34 <= pixelNativeColor.m_data[2] &&
                         ((pixelNativeColor.m_data[0] <= (int)fVar35 &&
                          (pixelNativeColor.m_data[1] <= (int)fVar36)))))) &&
                       (pixelNativeColor.m_data[2] <= (int)fVar37)) goto LAB_0094ac2f;
                    if (local_5ac < 4) {
                      lVar19 = (long)screenspaceLines.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_;
                      screenspaceLines.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)CONCAT44(screenspaceLines.
                                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_ + 1,
                                             screenspaceLines.
                                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_);
                      *(ulong *)((long)&screenspaceLines + lVar19 * 0x50 + 8) =
                           CONCAT44(rootPosition.m_data[1],rootPosition.m_data[0]);
                      *(undefined1 (*) [16])((long)&screenspaceLines + lVar19 * 0x50 + 0x10) =
                           auVar8;
                      alStack_248[lVar19 * 10] = CONCAT44((int)fVar37,(int)fVar36);
                      alStack_248[lVar19 * 10 + 1] = local_548;
                      alStack_248[lVar19 * 10 + 2] =
                           CONCAT44(-(uint)(0.0 <= fVar45) & auVar39._12_4_,__x);
                      alStack_248[lVar19 * 10 + 3] = (long)local_4f8;
                      alStack_248[lVar19 * 10 + 4] = CONCAT44(fVar9,fVar5);
                      alStack_248[lVar19 * 10 + 5] = CONCAT44(fVar11,fVar10);
                      alStack_248[lVar19 * 10 + 6] = lVar31;
                    }
                  }
                }
                if ((local_5ac < 4) &&
                   (0 < screenspaceLines.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_)) {
                  if (local_570 ==
                      (SingleSampleWideLineCandidate *)diamondGenerator.m_v1.m_data._0_8_) {
                    if ((long)local_570 - (long)local_598 == 0x7ffffffffffffff8) {
                      std::__throw_length_error("vector::_M_realloc_insert");
                    }
                    uVar18 = ((long)local_570 - (long)local_598) / 0xf8;
                    uVar32 = uVar18;
                    if (local_570 == local_598) {
                      uVar32 = 1;
                    }
                    uVar33 = uVar32 + uVar18;
                    __alloc = (allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>
                               *)0x84210842108421;
                    if (0x84210842108420 < uVar33) {
                      uVar33 = 0x84210842108421;
                    }
                    if (CARRY8(uVar32,uVar18)) {
                      uVar33 = 0x84210842108421;
                    }
                    if (uVar33 == 0) {
                      __result = (SingleSampleWideLineCandidate *)0x0;
                    }
                    else {
                      __result = (SingleSampleWideLineCandidate *)operator_new(uVar33 * 0xf8);
                    }
                    anon_unknown_3::SingleSampleWideLineCandidate::SingleSampleWideLineCandidate
                              (__result + uVar18,(SingleSampleWideLineCandidate *)&screenspaceLines)
                    ;
                    pSVar20 = std::
                              __uninitialized_move_if_noexcept_a<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate*,tcu::(anonymous_namespace)::SingleSampleWideLineCandidate*,std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>>
                                        (local_598,local_570,__result,__alloc);
                    local_570 = std::
                                __uninitialized_move_if_noexcept_a<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate*,tcu::(anonymous_namespace)::SingleSampleWideLineCandidate*,std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>>
                                          (local_570,local_570,pSVar20 + 1,
                                           (allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>
                                            *)0xf8);
                    std::
                    _Vector_base<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                    ::_M_deallocate((_Vector_base<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                                     *)local_598,
                                    (pointer)((diamondGenerator.m_v1.m_data._0_8_ - (long)local_598)
                                             / 0xf8),
                                    (diamondGenerator.m_v1.m_data._0_8_ - (long)local_598) % 0xf8);
                    diamondGenerator.m_v0.m_data._8_8_ = local_570;
                    diamondGenerator.m_v0.m_data._0_8_ = __result;
                    diamondGenerator.m_v1.m_data._0_8_ = __result + uVar33;
                    local_598 = __result;
                  }
                  else {
                    anon_unknown_3::SingleSampleWideLineCandidate::SingleSampleWideLineCandidate
                              (local_570,(SingleSampleWideLineCandidate *)&screenspaceLines);
                    local_570 = local_570 + 1;
                    diamondGenerator.m_v0.m_data._8_8_ = local_570;
                  }
                }
              }
              sVar26 = local_3f0 + 1;
            }
            local_5a0 = local_5a0 + 1;
            *(undefined4 *)
             ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar22 + iVar23) * 4) =
                 0xff0000ff;
            local_5ac = local_5ac + 1;
            if (local_5ac < 4) {
              screenspaceLines.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start = local_410;
              ppVVar27 = &screenspaceLines.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar27);
              std::operator<<((ostream *)ppVVar27,"Found an invalid pixel at (");
              std::ostream::operator<<(ppVVar27,iVar23);
              std::operator<<((ostream *)ppVVar27,",");
              std::ostream::operator<<(ppVVar27,iVar22);
              std::operator<<((ostream *)ppVVar27,"), ");
              uVar32 = ((long)local_570 - (long)local_598) / 0xf8;
              iVar28 = (int)uVar32;
              std::ostream::operator<<(ppVVar27,iVar28);
              std::operator<<((ostream *)ppVVar27," candidate reference value(s) found:\n");
              std::operator<<((ostream *)ppVVar27,"\tPixel color:\t\t");
              operator<<((ostream *)ppVVar27,color);
              std::operator<<((ostream *)ppVVar27,"\n");
              std::operator<<((ostream *)ppVVar27,"\tNative color:\t\t");
              operator<<((ostream *)ppVVar27,&pixelNativeColor);
              std::operator<<((ostream *)ppVVar27,"\n");
              uVar32 = uVar32 & 0xffffffff;
              if (iVar28 < 1) {
                uVar32 = 0;
              }
              local_4f8 = &local_598->interpolationCandidates[0].valueRangeMax;
              for (uVar18 = 0;
                  ppVVar27 = &screenspaceLines.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish, uVar18 != uVar32;
                  uVar18 = uVar18 + 1) {
                std::operator<<((ostream *)ppVVar27,"\tCandidate line (line ");
                pMVar15 = MessageBuilder::operator<<
                                    ((MessageBuilder *)&screenspaceLines,&local_598[uVar18].lineNdx)
                ;
                std::operator<<((ostream *)&pMVar15->m_str,"):\n");
                a = local_4f8;
                for (lVar31 = 0; lVar31 < local_598[uVar18].numCandidates; lVar31 = lVar31 + 1) {
                  ppVVar27 = &screenspaceLines.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  std::operator<<((ostream *)ppVVar27,"\t\tCandidate interpolation point (index ");
                  std::ostream::operator<<(ppVVar27,(int)lVar31);
                  std::operator<<((ostream *)ppVVar27,"):\n");
                  std::operator<<((ostream *)ppVVar27,
                                  "\t\t\tRoot fragment position (non-replicated fragment): ");
                  operator<<((ostream *)ppVVar27,(Vector<int,_2> *)(a[-6].m_data + 1));
                  std::operator<<((ostream *)ppVVar27,":\n");
                  std::operator<<((ostream *)ppVVar27,"\t\t\tReference native color min: ");
                  valueMin.m_data[0] = 0.0;
                  valueMin.m_data[1] = 0.0;
                  valueMin.m_data[2] = 0.0;
                  clamp<int,3>((tcu *)&offset,(IVec3 *)(a + -5),(Vector<int,_3> *)&valueMin,
                               &formatLimit);
                  operator<<((ostream *)ppVVar27,(Vector<int,_3> *)&offset);
                  std::operator<<((ostream *)ppVVar27,"\n");
                  std::operator<<((ostream *)ppVVar27,"\t\t\tReference native color max: ");
                  expandedP1.m_data[0] = 0.0;
                  expandedP1.m_data[1] = 0.0;
                  clamp<int,3>((tcu *)&expandedP0,(IVec3 *)(a + -4),(Vector<int,_3> *)&expandedP1,
                               &formatLimit);
                  operator<<((ostream *)ppVVar27,(Vector<int,_3> *)&expandedP0);
                  std::operator<<((ostream *)ppVVar27,"\n");
                  std::operator<<((ostream *)ppVVar27,"\t\t\tReference native float min: ");
                  local_508.m_data[0] = 0.0;
                  local_508.m_data[1] = 0.0;
                  local_508.m_data[2] = 0.0;
                  Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_420);
                  clamp<float,3>((tcu *)&numRasterized,a + -3,&local_508,&local_420);
                  operator<<((ostream *)
                             &screenspaceLines.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                             (Vector<float,_3> *)&numRasterized);
                  std::operator<<((ostream *)
                                  &screenspaceLines.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,"\n");
                  std::operator<<((ostream *)
                                  &screenspaceLines.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                  "\t\t\tReference native float max: ");
                  minorDirection.m_data[0] = 0;
                  minorDirection.m_data[1] = 0;
                  Vector<int,_3>::cast<float>((Vector<int,_3> *)&rootPosition);
                  clamp<float,3>((tcu *)&idealRootPos,a + -2,(Vector<float,_3> *)&minorDirection,
                                 (Vector<float,_3> *)&rootPosition);
                  operator<<((ostream *)
                             &screenspaceLines.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                             (Vector<float,_3> *)&idealRootPos);
                  std::operator<<((ostream *)
                                  &screenspaceLines.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,"\n");
                  std::operator<<((ostream *)
                                  &screenspaceLines.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,"\t\t\tFmin:\t");
                  local_348.m_data[0] = 0.0;
                  local_348.m_data[1] = 0.0;
                  local_348.m_data[2] = 0.0;
                  local_358 = &DAT_3f8000003f800000;
                  local_350 = 1.0;
                  ppVVar27 = &screenspaceLines.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  clamp<float,3>((tcu *)&local_304,a + -1,&local_348,(Vector<float,_3> *)&local_358)
                  ;
                  operator<<((ostream *)ppVVar27,&local_304);
                  std::operator<<((ostream *)ppVVar27,"\n");
                  std::operator<<((ostream *)ppVVar27,"\t\t\tFmax:\t");
                  local_368.m_data[0] = 0.0;
                  local_368.m_data[1] = 0.0;
                  local_368.m_data[2] = 0.0;
                  local_378 = &DAT_3f8000003f800000;
                  local_370 = 1.0;
                  clamp<float,3>((tcu *)&local_e4,a,&local_368,(Vector<float,_3> *)&local_378);
                  operator<<((ostream *)
                             &screenspaceLines.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&local_e4);
                  std::operator<<((ostream *)
                                  &screenspaceLines.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,"\n");
                  a = (Vec3 *)(a[6].m_data + 2);
                }
                local_4f8 = (Vec3 *)((long)(local_4f8 + 0x14) + 8);
              }
              MessageBuilder::operator<<
                        ((MessageBuilder *)&screenspaceLines,(EndMessageToken *)&TestLog::EndMessage
                        );
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar27);
            }
          }
LAB_0094ac2f:
          std::
          vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
          ::~vector((vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                     *)&diamondGenerator);
          iVar14 = iVar14 + 1;
        }
        __n = (size_t)(iVar22 + 1);
      }
      if (4 < local_5ac) {
        ppVVar27 = &screenspaceLines.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        screenspaceLines.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_start = local_410;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar27);
        std::operator<<((ostream *)ppVVar27,"Omitted ");
        std::ostream::operator<<(ppVVar27,local_5ac + -4);
        std::operator<<((ostream *)ppVVar27," pixel error description(s).");
        MessageBuilder::operator<<
                  ((MessageBuilder *)&screenspaceLines,(EndMessageToken *)&TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar27);
      }
      iVar22 = (int)log;
      if (local_5a0 == 0) {
        ppVVar27 = &screenspaceLines.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        screenspaceLines.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar27);
        std::operator<<((ostream *)ppVVar27,"No invalid pixels found.");
        MessageBuilder::operator<<
                  ((MessageBuilder *)&screenspaceLines,(EndMessageToken *)&TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar27);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&offset,"Verification result",(allocator<char> *)&numRasterized);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&valueMin,"Result of rendering",(allocator<char> *)&pixelNativeColor);
        LogImageSet::LogImageSet
                  ((LogImageSet *)&diamondGenerator,(string *)&offset,(string *)&valueMin);
        LogImageSet::write((LogImageSet *)&diamondGenerator,iVar22,__buf_02,__n);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&expandedP0,"Result",(allocator<char> *)&formatLimit);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&expandedP1,"Result",(allocator<char> *)&local_508);
        pSVar17 = surface;
        LogImage::LogImage((LogImage *)&screenspaceLines,(string *)&expandedP0,(string *)&expandedP1
                           ,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
        LogImage::write((LogImage *)&screenspaceLines,iVar22,__buf_03,(size_t)pSVar17);
        TestLog::endImageSet(log);
        LogImage::~LogImage((LogImage *)&screenspaceLines);
        std::__cxx11::string::~string((string *)&expandedP1);
        std::__cxx11::string::~string((string *)&expandedP0);
        LogImageSet::~LogImageSet((LogImageSet *)&diamondGenerator);
        std::__cxx11::string::~string((string *)&valueMin);
        this = (string *)&offset;
      }
      else {
        ppVVar27 = &screenspaceLines.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        screenspaceLines.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar27);
        std::ostream::operator<<(ppVVar27,local_5a0);
        std::operator<<((ostream *)ppVVar27," invalid pixel(s) found.");
        MessageBuilder::operator<<
                  ((MessageBuilder *)&screenspaceLines,(EndMessageToken *)&TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar27);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&valueMin,"Verification result",(allocator<char> *)&local_508);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&expandedP0,"Result of rendering",(allocator<char> *)&local_420);
        LogImageSet::LogImageSet((LogImageSet *)&offset,(string *)&valueMin,(string *)&expandedP0);
        LogImageSet::write((LogImageSet *)&offset,iVar22,__buf,__n);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&expandedP1,"Result",(allocator<char> *)&idealRootPos);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&numRasterized,"Result",(allocator<char> *)&minorDirection);
        pSVar17 = surface;
        LogImage::LogImage((LogImage *)&screenspaceLines,(string *)&expandedP1,
                           (string *)&numRasterized,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
        LogImage::write((LogImage *)&screenspaceLines,iVar22,__buf_00,(size_t)pSVar17);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pixelNativeColor,"ErrorMask",(allocator<char> *)&rootPosition);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&formatLimit,"ErrorMask",(allocator<char> *)&local_304);
        pSVar17 = &errorMask;
        LogImage::LogImage((LogImage *)&diamondGenerator,(string *)&pixelNativeColor,
                           (string *)&formatLimit,pSVar17,QP_IMAGE_COMPRESSION_MODE_BEST);
        LogImage::write((LogImage *)&diamondGenerator,iVar22,__buf_01,(size_t)pSVar17);
        TestLog::endImageSet(log);
        LogImage::~LogImage((LogImage *)&diamondGenerator);
        std::__cxx11::string::~string((string *)&formatLimit);
        std::__cxx11::string::~string((string *)&pixelNativeColor);
        LogImage::~LogImage((LogImage *)&screenspaceLines);
        std::__cxx11::string::~string((string *)&numRasterized);
        std::__cxx11::string::~string((string *)&expandedP1);
        LogImageSet::~LogImageSet((LogImageSet *)&offset);
        std::__cxx11::string::~string((string *)&expandedP0);
        this = (string *)&valueMin;
      }
      std::__cxx11::string::~string(this);
      TextureLevel::~TextureLevel(&referenceLineMap);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&rootPixelLocation);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&lineIsXMajor.super__Bvector_base<std::allocator<bool>_>);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&effectiveLines.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      Surface::~Surface(&errorMask);
      if (local_5a0 == 0) {
        return LINEINTERPOLATION_STRICTLY_CORRECT;
      }
    }
    else {
      bVar12 = anon_unknown_3::verifyLineGroupPixelIndependentInterpolation
                         (surface,scene,args,log,LINEINTERPOLATION_STRICTLY_CORRECT);
      if (bVar12) {
        return LINEINTERPOLATION_STRICTLY_CORRECT;
      }
    }
    ppVVar27 = &screenspaceLines.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    screenspaceLines.
    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar27);
    std::operator<<((ostream *)ppVVar27,
                    "Accurate verification failed, checking with projected weights (inaccurate equation)."
                   );
    MessageBuilder::operator<<
              ((MessageBuilder *)&screenspaceLines,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar27);
    bVar12 = anon_unknown_3::verifyLineGroupPixelIndependentInterpolation
                       (surface,scene,args,log,LINEINTERPOLATION_PROJECTED);
    LVar24 = LINEINTERPOLATION_INCORRECT - bVar12;
  }
  else {
    bVar12 = anon_unknown_3::verifyMultisampleLineGroupInterpolation(surface,scene,args,log);
    LVar24 = (uint)!bVar12 * 2;
  }
  return LVar24;
}

Assistant:

LineInterpolationMethod verifyLineGroupInterpolation (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	const bool multisampled = args.numSamples != 0;

	if (multisampled)
	{
		if (verifyMultisampleLineGroupInterpolation(surface, scene, args, log))
			return LINEINTERPOLATION_STRICTLY_CORRECT;
		return LINEINTERPOLATION_INCORRECT;
	}
	else
	{
		const bool isNarrow = (scene.lineWidth == 1.0f);

		// accurate interpolation
		if (isNarrow)
		{
			if (verifySinglesampleNarrowLineGroupInterpolation(surface, scene, args, log))
				return LINEINTERPOLATION_STRICTLY_CORRECT;
		}
		else
		{
			if (verifySinglesampleWideLineGroupInterpolation(surface, scene, args, log))
				return LINEINTERPOLATION_STRICTLY_CORRECT;
		}

		// check with projected (inaccurate) interpolation
		log << tcu::TestLog::Message << "Accurate verification failed, checking with projected weights (inaccurate equation)." << tcu::TestLog::EndMessage;
		if (verifyLineGroupInterpolationWithProjectedWeights(surface, scene, args, log))
			return LINEINTERPOLATION_PROJECTED;

		return LINEINTERPOLATION_INCORRECT;
	}
}